

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O0

int Gia_ManHashAnd(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *p1;
  int local_3c;
  int local_38;
  int *piStack_30;
  int iNode;
  int *pPlace;
  Gia_Obj_t *pObj;
  int iLit1_local;
  int iLit0_local;
  Gia_Man_t *p_local;
  
  if (iLit0 < 2) {
    local_38 = iLit1;
    if (iLit0 == 0) {
      local_38 = 0;
    }
    p_local._4_4_ = local_38;
  }
  else if (iLit1 < 2) {
    local_3c = iLit0;
    if (iLit1 == 0) {
      local_3c = 0;
    }
    p_local._4_4_ = local_3c;
  }
  else {
    p_local._4_4_ = iLit1;
    if (iLit0 != iLit1) {
      iVar1 = Abc_LitNot(iLit1);
      if (iLit0 == iVar1) {
        p_local._4_4_ = 0;
      }
      else if (p->fGiaSimple == 0) {
        if ((p->nObjs & 0xffU) == 0) {
          iVar1 = Vec_IntSize(&p->vHTable);
          iVar2 = Gia_ManAndNum(p);
          if (iVar1 << 1 < iVar2) {
            Gia_ManHashResize(p);
          }
        }
        if (p->fAddStrash != 0) {
          pGVar3 = Gia_ObjFromLit(p,iLit0);
          p1 = Gia_ObjFromLit(p,iLit1);
          pGVar3 = Gia_ManAddStrash(p,pGVar3,p1);
          if (pGVar3 != (Gia_Obj_t *)0x0) {
            iVar1 = Gia_ObjToLit(p,pGVar3);
            return iVar1;
          }
        }
        pObj._0_4_ = iLit1;
        pObj._4_4_ = iLit0;
        if (iLit1 < iLit0) {
          pObj._0_4_ = iLit0;
          pObj._4_4_ = iLit1;
        }
        piStack_30 = Gia_ManHashFind(p,pObj._4_4_,(int)pObj,-1);
        if (*piStack_30 == 0) {
          p->nHashMiss = p->nHashMiss + 1;
          iVar1 = Vec_IntSize(&p->vHash);
          iVar2 = Vec_IntCap(&p->vHash);
          if (iVar1 < iVar2) {
            iVar1 = Gia_ManAppendAnd(p,pObj._4_4_,(int)pObj);
            iVar1 = Abc_Lit2Var(iVar1);
            *piStack_30 = iVar1;
          }
          else {
            iVar1 = Gia_ManAppendAnd(p,pObj._4_4_,(int)pObj);
            piStack_30 = Gia_ManHashFind(p,pObj._4_4_,(int)pObj,-1);
            if (*piStack_30 != 0) {
              __assert_fail("*pPlace == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaHash.c"
                            ,0x267,"int Gia_ManHashAnd(Gia_Man_t *, int, int)");
            }
            iVar1 = Abc_Lit2Var(iVar1);
            *piStack_30 = iVar1;
          }
          p_local._4_4_ = Abc_Var2Lit(*piStack_30,0);
        }
        else {
          p->nHashHit = p->nHashHit + 1;
          p_local._4_4_ = Abc_Var2Lit(*piStack_30,0);
        }
      }
      else {
        iVar1 = Vec_IntSize(&p->vHTable);
        if (iVar1 != 0) {
          __assert_fail("Vec_IntSize(&p->vHTable) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaHash.c"
                        ,0x24c,"int Gia_ManHashAnd(Gia_Man_t *, int, int)");
        }
        p_local._4_4_ = Gia_ManAppendAnd(p,iLit0,iLit1);
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManHashAnd( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    if ( iLit0 < 2 )
        return iLit0 ? iLit1 : 0;
    if ( iLit1 < 2 )
        return iLit1 ? iLit0 : 0;
    if ( iLit0 == iLit1 )
        return iLit1;
    if ( iLit0 == Abc_LitNot(iLit1) )
        return 0;
    if ( p->fGiaSimple )
    {
        assert( Vec_IntSize(&p->vHTable) == 0 );
        return Gia_ManAppendAnd( p, iLit0, iLit1 );
    }
    if ( (p->nObjs & 0xFF) == 0 && 2 * Vec_IntSize(&p->vHTable) < Gia_ManAndNum(p) )
        Gia_ManHashResize( p );
    if ( p->fAddStrash )
    {
        Gia_Obj_t * pObj = Gia_ManAddStrash( p, Gia_ObjFromLit(p, iLit0), Gia_ObjFromLit(p, iLit1) );
        if ( pObj != NULL )
            return Gia_ObjToLit( p, pObj );
    }
    if ( iLit0 > iLit1 )
        iLit0 ^= iLit1, iLit1 ^= iLit0, iLit0 ^= iLit1;
    {
        int * pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
        if ( *pPlace )
        {
            p->nHashHit++;
            return Abc_Var2Lit( *pPlace, 0 );
        }
        p->nHashMiss++;
        if ( Vec_IntSize(&p->vHash) < Vec_IntCap(&p->vHash) )
            *pPlace = Abc_Lit2Var( Gia_ManAppendAnd( p, iLit0, iLit1 ) );
        else
        {
            int iNode = Gia_ManAppendAnd( p, iLit0, iLit1 );
            pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
            assert( *pPlace == 0 );
            *pPlace = Abc_Lit2Var( iNode );
        }
        return Abc_Var2Lit( *pPlace, 0 );
    }
}